

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_propagator.cpp
# Opt level: O2

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateChildren
          (StatisticsPropagator *this,LogicalOperator *node,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  idx_t child_idx;
  ulong __n;
  
  for (__n = 0; __n < (ulong)((long)node_ptr[3].
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl -
                              (long)node_ptr[2].
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl >> 3); __n = __n + 1) {
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::get<true>((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 *)(node_ptr + 2),__n);
    PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffc8,
                        (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                         *)node);
    ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
                &stack0xffffffffffffffc8);
  }
  this->optimizer = (Optimizer *)0x0;
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateChildren(LogicalOperator &node,
                                                                   unique_ptr<LogicalOperator> &node_ptr) {
	for (idx_t child_idx = 0; child_idx < node.children.size(); child_idx++) {
		PropagateStatistics(node.children[child_idx]);
	}
	return nullptr;
}